

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RatioSequence.cpp
# Opt level: O2

void __thiscall RatioSequence::RatioSequence(RatioSequence *this,string *ptA,string *ptB)

{
  invalid_argument *this_00;
  size_type sVar1;
  size_type __n;
  vector<double,_std::allocator<double>_> dblvecB;
  vector<double,_std::allocator<double>_> dblvecA;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strvecB;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strvecA;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Ratio local_68;
  
  (this->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->combineCode = 0;
  (this->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  Tools::string_split(&strvecA,ptA,", ","(,)");
  Tools::string_split(&strvecB,ptB,", ","(,)");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_130,&strvecA);
  Tools::stringvec_to_doublevec(&dblvecA,&local_130);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_130);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148,&strvecB);
  Tools::stringvec_to_doublevec(&dblvecB,&local_148);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  if ((long)dblvecA.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)dblvecA.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)dblvecB.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)dblvecB.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start) {
    __n = (long)dblvecA.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)dblvecA.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
    std::vector<Ratio,_std::allocator<Ratio>_>::reserve(&this->_RatioSequence,__n);
    for (sVar1 = 0; __n != sVar1; sVar1 = sVar1 + 1) {
      Ratio::Ratio(&local_68,
                   dblvecA.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar1],
                   dblvecB.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar1]);
      std::vector<Ratio,_std::allocator<Ratio>_>::emplace_back<Ratio>
                (&this->_RatioSequence,&local_68);
      Ratio::~Ratio(&local_68);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&dblvecB.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&dblvecA.super__Vector_base<double,_std::allocator<double>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&strvecB);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&strvecA);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_e8,"Coordinates have different numbers of dimensions: (",ptA);
  std::operator+(&local_c8,&local_e8,"),(");
  std::operator+(&local_a8,&local_c8,ptB);
  std::operator+(&local_88,&local_a8,")");
  std::invalid_argument::invalid_argument(this_00,(string *)&local_88);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

RatioSequence::RatioSequence(string ptA, string ptB) {
    auto strvecA = Tools::string_split(ptA, ", ", "(,)");
    auto strvecB = Tools::string_split(ptB, ", ", "(,)");
    auto dblvecA = Tools::stringvec_to_doublevec(strvecA);
    auto dblvecB = Tools::stringvec_to_doublevec(strvecB);
    if (dblvecA.size() != dblvecB.size())
        throw std::invalid_argument("Coordinates have different numbers of dimensions: (" + ptA + "),(" + ptB + ")");
    size_t len = dblvecA.size();
    _RatioSequence.reserve(len);
    for (size_t i=0; i < len; ++i) {
        this->push_back_value(Ratio(dblvecA[i], dblvecB[i]));
    }
}